

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_value.cpp
# Opt level: O0

void __thiscall Json::Value::CZString::CZString(CZString *this,CZString *other)

{
  uint local_34;
  char *local_28;
  CZString *other_local;
  CZString *this_local;
  
  if ((other->index_ == 0) || (other->cstr_ == (char *)0x0)) {
    local_28 = other->cstr_;
  }
  else {
    local_28 = duplicateStringValue(other->cstr_,0xffffffff);
  }
  this->cstr_ = local_28;
  if (other->cstr_ == (char *)0x0) {
    local_34 = other->index_;
  }
  else {
    local_34 = (uint)(other->index_ != 0);
  }
  this->index_ = local_34;
  return;
}

Assistant:

Value::CZString::CZString( const CZString &other )
: cstr_( other.index_ != noDuplication &&  other.cstr_ != 0
                ?  duplicateStringValue( other.cstr_ )
                : other.cstr_ )
   , index_( other.cstr_ ? (other.index_ == noDuplication ? noDuplication : duplicate)
                         : other.index_ )
{
}